

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> __thiscall
duckdb::WriteAheadLog::Replay
          (WriteAheadLog *this,FileSystem *fs,AttachedDatabase *db,string *wal_path)

{
  bool bVar1;
  WriteAheadLog *pWVar2;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_40;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_38;
  WriteAheadLog *local_30;
  
  (*fs->_vptr_FileSystem[2])(&local_38,fs,wal_path,0x81,0x100,0);
  if (local_38._M_head_impl == (FileHandle *)0x0) {
    pWVar2 = (WriteAheadLog *)operator_new(0x70);
    WriteAheadLog(pWVar2,db,wal_path,0,NO_WAL);
    this->_vptr_WriteAheadLog = (_func_int **)pWVar2;
  }
  else {
    local_40._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (FileHandle *)0x0;
    ReplayInternal((WriteAheadLog *)&stack0xffffffffffffffd0,db,
                   (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
                   &local_40);
    if (local_40._M_head_impl != (FileHandle *)0x0) {
      (*(local_40._M_head_impl)->_vptr_FileHandle[1])();
    }
    local_40._M_head_impl = (FileHandle *)0x0;
    pWVar2 = local_30;
    if (local_30 == (WriteAheadLog *)0x0) {
      bVar1 = AttachedDatabase::IsReadOnly(db);
      if (!bVar1) {
        (*fs->_vptr_FileSystem[0x14])(fs,wal_path,0);
      }
      pWVar2 = (WriteAheadLog *)operator_new(0x70);
      WriteAheadLog(pWVar2,db,wal_path,0,NO_WAL);
    }
    this->_vptr_WriteAheadLog = (_func_int **)pWVar2;
  }
  if (local_38._M_head_impl != (FileHandle *)0x0) {
    (*(local_38._M_head_impl)->_vptr_FileHandle[1])();
  }
  return (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)
         (unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>)this;
}

Assistant:

unique_ptr<WriteAheadLog> WriteAheadLog::Replay(FileSystem &fs, AttachedDatabase &db, const string &wal_path) {
	auto handle = fs.OpenFile(wal_path, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
	if (!handle) {
		// WAL does not exist - instantiate an empty WAL
		return make_uniq<WriteAheadLog>(db, wal_path);
	}
	auto wal_handle = ReplayInternal(db, std::move(handle));
	if (wal_handle) {
		return wal_handle;
	}
	// replay returning NULL indicates we can nuke the WAL entirely - but only if this is not a read-only connection
	if (!db.IsReadOnly()) {
		fs.RemoveFile(wal_path);
	}
	return make_uniq<WriteAheadLog>(db, wal_path);
}